

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
          (IdleDecommitPageAllocator *this,AllocationPolicyManager *policyManager,
          PageAllocatorType type,ConfigFlagsTable *flagTable,uint maxFreePageCount,
          uint maxIdleFreePageCount,bool zeroPages,BackgroundPageQueue *backgroundPageQueue,
          uint maxAllocPageCount,bool enableWriteBarrier)

{
  HANDLE processHandle;
  
  processHandle = GetCurrentProcess();
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::PageAllocatorBase(&this->super_PageAllocator,policyManager,flagTable,type,maxFreePageCount,
                      zeroPages,backgroundPageQueue,maxAllocPageCount,0,false,false,processHandle,
                      enableWriteBarrier);
  (this->super_PageAllocator)._vptr_PageAllocatorBase =
       (_func_int **)&PTR_SetDisableThreadAccessCheck_014d9408;
  this->maxIdleDecommitFreePageCount = maxIdleFreePageCount;
  this->maxNonIdleDecommitFreePageCount = maxFreePageCount;
  this->hasDecommitTimer = false;
  this->hadDecommitTimer = false;
  this->idleDecommitTryEnterWaitFactor = 0;
  (this->cs).super_CCLock.mutexPtr[0] = '\0';
  (this->cs).super_CCLock.mutexPtr[1] = '\0';
  (this->cs).super_CCLock.mutexPtr[2] = '\0';
  (this->cs).super_CCLock.mutexPtr[3] = '\0';
  (this->cs).super_CCLock.mutexPtr[4] = '\0';
  (this->cs).super_CCLock.mutexPtr[5] = '\0';
  (this->cs).super_CCLock.mutexPtr[6] = '\0';
  (this->cs).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->cs).super_CCLock,true);
  (this->super_PageAllocator).idleDecommitEnterCount =
       (uint)(maxIdleFreePageCount == maxFreePageCount);
  this->idleDecommitCount = 0;
  return;
}

Assistant:

IdleDecommitPageAllocator::IdleDecommitPageAllocator(AllocationPolicyManager * policyManager, PageAllocatorType type,
    Js::ConfigFlagsTable& flagTable,
    uint maxFreePageCount, uint maxIdleFreePageCount,
    bool zeroPages,
#if ENABLE_BACKGROUND_PAGE_FREEING 
    BackgroundPageQueue *  backgroundPageQueue,
#endif
    uint maxAllocPageCount, bool enableWriteBarrier) :
#ifdef IDLE_DECOMMIT_ENABLED
    idleDecommitTryEnterWaitFactor(0),
    hasDecommitTimer(false),
    hadDecommitTimer(false),
#endif
    PageAllocator(policyManager, flagTable, type, maxFreePageCount, zeroPages,
#if ENABLE_BACKGROUND_PAGE_FREEING
    backgroundPageQueue,
#endif        
    maxAllocPageCount, 0, false, false, GetCurrentProcess(), enableWriteBarrier),
    maxIdleDecommitFreePageCount(maxIdleFreePageCount),
    maxNonIdleDecommitFreePageCount(maxFreePageCount)
{
    // if maxIdle is the same as max free, disable idleDecommit but setting the entry count to 1
    this->idleDecommitEnterCount = (maxIdleFreePageCount == maxFreePageCount);
#ifdef IDLE_DECOMMIT_ENABLED
#if DBG_DUMP
    idleDecommitCount = 0;
#endif
#endif
}